

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,TryNode *tryNode)

{
  StmtNode *pSVar1;
  
  pSVar1 = tryNode->tryStmt;
  if (pSVar1 != (StmtNode *)0x0) {
    (*(pSVar1->super_ASTNode)._vptr_ASTNode[3])(pSVar1,this);
  }
  pSVar1 = tryNode->catchStmt;
  if (pSVar1 != (StmtNode *)0x0) {
    (*(pSVar1->super_ASTNode)._vptr_ASTNode[3])(pSVar1,this);
    return;
  }
  return;
}

Assistant:

void SemanticTypes::visit(TryNode *tryNode) {

    if (tryNode->getTry()) {
        tryNode->getTry()->accept(this);
    }

    if (tryNode->getCatch()) {
        tryNode->getCatch()->accept(this);
    }

}